

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_new_session_ticket
              (ptls_t *tls,uint32_t *lifetime,uint32_t *age_add,ptls_iovec_t *nonce,
              ptls_iovec_t *ticket,uint32_t *max_early_data_size,uint8_t *src,uint8_t *end)

{
  st_ptls_on_extension_t *psVar1;
  uint8_t *end_00;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  ushort *puVar5;
  ushort id;
  uint8_t *puVar6;
  ushort *puVar7;
  ushort *puVar8;
  ptls_iovec_t pVar9;
  st_ptls_extension_bitmap_t local_38;
  
  end_00 = end;
  iVar3 = ptls_decode32(lifetime,&src,end);
  if (((iVar3 == 0) && (iVar3 = ptls_decode32(age_add,&src,end_00), iVar3 == 0)) &&
     (iVar3 = 0x32, src != end_00)) {
    uVar4 = (ulong)*src;
    puVar6 = src + 1;
    if (uVar4 <= (ulong)((long)end_00 - (long)puVar6)) {
      nonce->base = puVar6;
      puVar7 = (ushort *)(puVar6 + uVar4);
      nonce->len = uVar4;
      if (1 < (ulong)((long)end_00 - (long)puVar7)) {
        uVar4 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
        puVar7 = puVar7 + 1;
        if (uVar4 - 1 < (ulong)((long)end_00 - (long)puVar7)) {
          ticket->base = (uint8_t *)puVar7;
          ticket->len = uVar4;
          *max_early_data_size = 0;
          puVar7 = (ushort *)((long)puVar7 + uVar4);
          builtin_memcpy(local_38.bits,"!$\x11",4);
          local_38.bits[4] = '\0';
          local_38.bits[5] = ':';
          local_38.bits[6] = '\b';
          local_38.bits[7] = '\0';
          if (1 < (ulong)((long)end_00 - (long)puVar7)) {
            uVar4 = (ulong)(ushort)(*puVar7 << 8 | *puVar7 >> 8);
            puVar7 = puVar7 + 1;
            if (uVar4 <= (ulong)((long)end_00 - (long)puVar7)) {
              puVar5 = (ushort *)(uVar4 + (long)puVar7);
              while( true ) {
                if (puVar7 == puVar5) {
                  if (puVar5 != (ushort *)end_00) {
                    return 0x32;
                  }
                  return 0;
                }
                if ((long)puVar5 - (long)puVar7 < 2) {
                  return 0x32;
                }
                id = *puVar7 << 8 | *puVar7 >> 8;
                if ((id < 0x40) && ((local_38.bits[id >> 3] >> (id & 7) & 1) != 0)) break;
                src = (uint8_t *)(puVar7 + 1);
                extension_bitmap_set(&local_38,id);
                if ((ulong)((long)puVar5 - (long)(puVar7 + 1)) < 2) {
                  return 0x32;
                }
                uVar2 = puVar7[1] << 8 | puVar7[1] >> 8;
                puVar8 = puVar7 + 2;
                if ((ulong)((long)puVar5 - (long)puVar8) < (ulong)uVar2) {
                  return 0x32;
                }
                psVar1 = tls->ctx->on_extension;
                src = (uint8_t *)puVar8;
                if ((psVar1 != (st_ptls_on_extension_t *)0x0) &&
                   (pVar9.len._0_2_ = uVar2, pVar9.base = (uint8_t *)puVar8, pVar9.len._2_6_ = 0,
                   iVar3 = (*psVar1->cb)(psVar1,tls,'\x04',id,pVar9), iVar3 != 0)) {
                  return 1;
                }
                puVar8 = (ushort *)((long)puVar8 + (ulong)uVar2);
                puVar7 = puVar8;
                if ((id == 0x2a) &&
                   (iVar3 = ptls_decode32(max_early_data_size,&src,(uint8_t *)puVar8),
                   puVar7 = (ushort *)src, iVar3 != 0)) {
                  return iVar3;
                }
                if (puVar7 != puVar8) {
                  return 0x32;
                }
              }
              iVar3 = 0x2f;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int decode_new_session_ticket(ptls_t *tls, uint32_t *lifetime, uint32_t *age_add, ptls_iovec_t *nonce, ptls_iovec_t *ticket,
                                     uint32_t *max_early_data_size, const uint8_t *src, const uint8_t *const end)
{
    uint16_t exttype;
    int ret;

    if ((ret = ptls_decode32(lifetime, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode32(age_add, &src, end)) != 0)
        goto Exit;
    ptls_decode_open_block(src, end, 1, {
        *nonce = ptls_iovec_init(src, end - src);
        src = end;
    });
    ptls_decode_open_block(src, end, 2, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        *ticket = ptls_iovec_init(src, end - src);
        src = end;
    });

    *max_early_data_size = 0;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            if ((ret = ptls_decode32(max_early_data_size, &src, end)) != 0)
                goto Exit;
            break;
        default:
            src = end;
            break;
        }
    });

    ret = 0;
Exit:
    return ret;
}